

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.cpp
# Opt level: O3

unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true> __thiscall
duckdb::PhysicalPlanGenerator::PlanInternal(PhysicalPlanGenerator *this,LogicalOperator *op)

{
  pointer *this_00;
  idx_t iVar1;
  int iVar2;
  Allocator *allocator;
  pointer __p;
  undefined4 extraout_var;
  pointer pPVar3;
  PhysicalOperator *pPVar4;
  DBConfig *pDVar5;
  pointer pPVar6;
  LogicalOperator *in_RDX;
  
  this_00 = &op[2].children.
             super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (op[2].children.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    allocator = Allocator::Get((ClientContext *)
                               op[2].children.
                               super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
    __p = (pointer)operator_new(0x68);
    ArenaAllocator::ArenaAllocator((ArenaAllocator *)__p,allocator,0x800);
    (__p->ops).
    super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__p->root).ptr = (PhysicalOperator *)0x0;
    (__p->ops).
    super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->ops).
    super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>::reset
              ((__uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_> *)
               this_00,__p);
  }
  iVar2 = (*in_RDX->_vptr_LogicalOperator[7])();
  in_RDX->estimated_cardinality = CONCAT44(extraout_var,iVar2);
  pPVar3 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
           operator->((unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                       *)this_00);
  pPVar4 = CreatePlan((PhysicalPlanGenerator *)op,in_RDX);
  (pPVar3->root).ptr = pPVar4;
  iVar1 = in_RDX->estimated_cardinality;
  pPVar3 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
           operator->((unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                       *)this_00);
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&pPVar3->root);
  ((pPVar3->root).ptr)->estimated_cardinality = iVar1;
  pDVar5 = DBConfig::GetConfig((ClientContext *)
                               op[2].children.
                               super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
  if (DICTIONARY_EXPRESSION < (pDVar5->options).debug_verify_vector) {
    pPVar3 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
             operator->((unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                         *)this_00);
    pPVar6 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
             operator->((unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                         *)this_00);
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&pPVar6->root);
    pPVar4 = (pPVar6->root).ptr;
    pPVar6 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
             operator->((unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                         *)this_00);
    pPVar4 = PhysicalPlan::
             Make<duckdb::PhysicalVerifyVector,duckdb::PhysicalOperator&,duckdb::DebugVectorVerification&>
                       (pPVar6,pPVar4,&(pDVar5->options).debug_verify_vector);
    (pPVar3->root).ptr = pPVar4;
  }
  (this->dependencies).set._M_h._M_buckets = (__buckets_ptr)*this_00;
  *this_00 = (pointer)0x0;
  return (unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>)
         (unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>)this;
}

Assistant:

unique_ptr<PhysicalPlan> PhysicalPlanGenerator::PlanInternal(LogicalOperator &op) {
	if (!physical_plan) {
		physical_plan = make_uniq<PhysicalPlan>(Allocator::Get(context));
	}
	op.estimated_cardinality = op.EstimateCardinality(context);
	physical_plan->SetRoot(CreatePlan(op));
	physical_plan->Root().estimated_cardinality = op.estimated_cardinality;

	auto &config = DBConfig::GetConfig(context);
	if (config.options.debug_verify_vector != DebugVectorVerification::NONE) {
		if (config.options.debug_verify_vector != DebugVectorVerification::DICTIONARY_EXPRESSION) {
			physical_plan->SetRoot(
			    Make<PhysicalVerifyVector>(physical_plan->Root(), config.options.debug_verify_vector));
		}
	}
	return std::move(physical_plan);
}